

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QSimplexVariable_*>::reserve(QList<QSimplexVariable_*> *this,qsizetype asize)

{
  uint uVar1;
  Data *pDVar2;
  long lVar3;
  QArrayData *pQVar4;
  QArrayData *pQVar5;
  QSimplexVariable **__dest;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= (pDVar2->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3))) {
    uVar1 = (pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar1 & 1) != 0) goto LAB_0064454d;
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar1 | 1;
      goto LAB_0064454d;
    }
  }
  lVar3 = (this->d).size;
  if (asize < lVar3) {
    asize = lVar3;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  __dest = (QSimplexVariable **)QArrayData::allocate(&local_30,8,0x10,asize,KeepSize);
  pQVar5 = local_30;
  lVar3 = (this->d).size;
  if (lVar3 != 0) {
    memcpy(__dest,(this->d).ptr,lVar3 * 8);
  }
  if (pQVar5 != (QArrayData *)0x0) {
    *(byte *)&(pQVar5->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pQVar5->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pQVar4 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)pQVar5;
  (this->d).ptr = __dest;
  (this->d).size = lVar3;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,8,0x10);
    }
  }
LAB_0064454d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}